

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QString>>
          (QtPrivate *this,QDebug debug,char *which,QList<QString> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  long lVar3;
  undefined8 uVar4;
  storage_type *psVar5;
  QString *pQVar6;
  QString *pQVar7;
  storage_type *psVar8;
  char16_t *pcVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QDebugStateSaver saver;
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar2 = *(QTextStream **)debug.stream;
  pQVar2[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar5 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar5 + 1;
      pcVar1 = which + 1 + (long)psVar5;
      psVar5 = psVar8;
    } while (*pcVar1 != '\0');
  }
  QVar10.m_data = psVar8;
  QVar10.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar7 = (c->d).ptr;
  lVar3 = (c->d).size;
  pQVar6 = pQVar7 + lVar3;
  if (lVar3 != 0) {
    pcVar9 = (pQVar7->d).ptr;
    if (pcVar9 == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)debug.stream,(ulong)pcVar9);
    if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
    }
    pQVar7 = pQVar7 + 1;
  }
  if (pQVar7 != pQVar6) {
    do {
      pQVar2 = *(QTextStream **)debug.stream;
      QVar11.m_data = (storage_type *)0x2;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(pQVar2,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      pcVar9 = (pQVar7->d).ptr;
      if (pcVar9 == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)debug.stream,(ulong)pcVar9);
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      pQVar7 = pQVar7 + 1;
    } while (pQVar7 != pQVar6);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  uVar4 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar4;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}